

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O2

size_t HUF_buildCTable_wksp
                 (HUF_CElt *tree,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  ulong uVar1;
  char *pcVar2;
  int *piVar3;
  byte bVar4;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  ushort uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  size_t sVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  nodeElt *huffNode0;
  uint uVar25;
  size_t sStack_b0;
  U16 nbPerRank [13];
  ushort auStack_58 [20];
  
  if (((ulong)workSpace & 3) == 0) {
    if (wkspSize < 0x1100) {
      sStack_b0 = 0xffffffffffffffbe;
    }
    else if (maxSymbolValue < 0x100) {
      uVar1 = (ulong)maxSymbolValue + 1;
      memset(workSpace,0,0x1100);
      for (uVar18 = 0; uVar1 != uVar18; uVar18 = uVar18 + 1) {
        uVar25 = 0x1f;
        if (count[uVar18] + 1 != 0) {
          for (; count[uVar18] + 1 >> uVar25 == 0; uVar25 = uVar25 - 1) {
          }
        }
        piVar3 = (int *)((long)workSpace + (ulong)uVar25 * 8 + 0x1000);
        *piVar3 = *piVar3 + 1;
      }
      for (lVar6 = 0x21e; lVar6 != 0x1ff; lVar6 = lVar6 + -1) {
        iVar10 = *(int *)((long)workSpace + lVar6 * 8) + *(int *)((long)workSpace + lVar6 * 8 + 8);
        *(int *)((long)workSpace + lVar6 * 8) = iVar10;
        *(int *)((long)workSpace + lVar6 * 8 + 4) = iVar10;
      }
      for (uVar18 = 0; uVar18 != uVar1; uVar18 = uVar18 + 1) {
        uVar25 = count[uVar18];
        uVar21 = 0x1f;
        if (uVar25 + 1 != 0) {
          for (; uVar25 + 1 >> uVar21 == 0; uVar21 = uVar21 - 1) {
          }
        }
        uVar15 = (ulong)uVar21;
        uVar21 = *(uint *)((long)workSpace + uVar15 * 8 + 0x100c);
        *(uint *)((long)workSpace + uVar15 * 8 + 0x100c) = uVar21 + 1;
        uVar7 = (ulong)uVar21;
        while ((*(uint *)((long)workSpace + uVar15 * 8 + 0x1008) < (uint)uVar7 &&
               (uVar24 = (ulong)((uint)uVar7 - 1),
               *(uint *)((long)workSpace + uVar24 * 8 + 8) < uVar25))) {
          *(undefined8 *)((long)workSpace + uVar7 * 8 + 8) =
               *(undefined8 *)((long)workSpace + uVar24 * 8 + 8);
          uVar7 = uVar24;
        }
        *(uint *)((long)workSpace + uVar7 * 8 + 8) = uVar25;
        *(char *)((long)workSpace + uVar7 * 8 + 0xe) = (char)uVar18;
      }
      lVar6 = ((ulong)maxSymbolValue << 0x20) + 0x10000000000;
      uVar18 = uVar1;
      uVar25 = maxSymbolValue + 0xff;
      do {
        uVar21 = uVar25;
        lVar6 = lVar6 + -0x100000000;
        iVar10 = *(int *)((long)workSpace + uVar18 * 8);
        uVar18 = uVar18 - 1;
        uVar25 = uVar21 - 1;
      } while (iVar10 == 0);
      *(int *)((long)workSpace + 0x808) = iVar10 + *(int *)((long)workSpace + uVar18 * 8);
      *(undefined2 *)((long)workSpace + uVar18 * 8 + 4) = 0x100;
      *(undefined2 *)((long)workSpace + uVar18 * 8 + 0xc) = 0x100;
      lVar6 = lVar6 >> 0x20;
      for (lVar13 = 0x101; lVar13 <= lVar6; lVar13 = lVar13 + 1) {
        *(undefined4 *)((long)workSpace + lVar13 * 8 + 8) = 0x40000000;
      }
      iVar10 = uVar21 - 0x101;
      *(undefined4 *)workSpace = 0x80000000;
      iVar20 = 0x100;
      for (lVar13 = 0x101; lVar13 <= lVar6; lVar13 = lVar13 + 1) {
        uVar21 = *(uint *)((long)workSpace + (long)iVar10 * 8 + 8);
        uVar23 = *(uint *)((long)workSpace + (long)iVar20 * 8 + 8);
        iVar19 = (iVar20 + 1) - (uint)(uVar21 < uVar23);
        iVar16 = iVar20;
        if (uVar21 < uVar23) {
          iVar16 = iVar10;
        }
        uVar12 = (uint)(uVar21 < uVar23);
        iVar22 = iVar10 - uVar12;
        uVar21 = *(uint *)((long)workSpace + (long)iVar22 * 8 + 8);
        uVar23 = *(uint *)((long)workSpace + (long)iVar19 * 8 + 8);
        iVar20 = (iVar19 + 1) - (uint)(uVar21 < uVar23);
        iVar10 = (iVar10 - uVar12) - (uint)(uVar21 < uVar23);
        if (uVar21 < uVar23) {
          iVar19 = iVar22;
        }
        *(int *)((long)workSpace + lVar13 * 8 + 8) =
             *(int *)((long)workSpace + (long)iVar19 * 8 + 8) +
             *(int *)((long)workSpace + (long)iVar16 * 8 + 8);
        *(short *)((long)workSpace + (long)iVar19 * 8 + 0xc) = (short)lVar13;
        *(short *)((long)workSpace + (long)iVar16 * 8 + 0xc) = (short)lVar13;
      }
      *(undefined1 *)((long)workSpace + lVar6 * 8 + 0xf) = 0;
      for (uVar7 = (ulong)uVar25; 0xff < (int)uVar7; uVar7 = uVar7 - 1) {
        *(char *)((long)workSpace + uVar7 * 8 + 0xf) =
             *(char *)((long)workSpace +
                      (ulong)*(ushort *)((long)workSpace + uVar7 * 8 + 0xc) * 8 + 0xf) + '\x01';
      }
      iVar10 = (int)uVar18;
      sStack_b0 = 0xffffffffffffffff;
      sVar14 = (long)iVar10;
      if ((long)iVar10 < 0) {
        sVar14 = sStack_b0;
      }
      for (lVar6 = 0; sVar14 + 1 != lVar6; lVar6 = lVar6 + 1) {
        *(char *)((long)workSpace + lVar6 * 8 + 0xf) =
             *(char *)((long)workSpace +
                      (ulong)*(ushort *)((long)workSpace + lVar6 * 8 + 0xc) * 8 + 0xf) + '\x01';
      }
      uVar25 = 0xb;
      if (maxNbBits != 0) {
        uVar25 = maxNbBits;
      }
      bVar4 = *(byte *)((long)workSpace + (uVar18 & 0xffffffff) * 8 + 0xf);
      iVar20 = bVar4 - uVar25;
      if (uVar25 <= bVar4 && iVar20 != 0) {
        bVar8 = (byte)iVar20;
        uVar18 = (long)iVar10 + 1;
        iVar20 = 0;
        while (bVar5 = *(byte *)((long)workSpace + uVar18 * 8 + 7), uVar25 < bVar5) {
          iVar20 = iVar20 + (1 << (bVar8 & 0x1f)) + (-1 << (bVar4 - bVar5 & 0x1f));
          *(char *)((long)workSpace + uVar18 * 8 + 7) = (char)uVar25;
          uVar18 = uVar18 - 1;
        }
        do {
          lVar6 = uVar18 * 8;
          uVar18 = uVar18 - 1;
        } while (uVar25 == *(byte *)((long)workSpace + lVar6 + 7));
        nbPerRank[8] = 0xf0f0;
        nbPerRank[9] = 0xf0f0;
        nbPerRank[10] = 0xf0f0;
        nbPerRank[0xb] = 0xf0f0;
        nbPerRank[0xc] = 0xf0f0;
        nbPerRank[0] = 0xf0f0;
        nbPerRank[1] = 0xf0f0;
        nbPerRank[2] = 0xf0f0;
        nbPerRank[3] = 0xf0f0;
        nbPerRank[4] = 0xf0f0;
        nbPerRank[5] = 0xf0f0;
        nbPerRank[6] = 0xf0f0;
        nbPerRank[7] = 0xf0f0;
        uVar7 = uVar18 & 0xffffffff;
        uVar21 = uVar25;
        while (iVar16 = (int)uVar7, -1 < iVar16) {
          bVar4 = *(byte *)((long)workSpace + uVar7 * 8 + 0xf);
          if (bVar4 < uVar21) {
            uVar21 = (uint)bVar4;
            *(int *)(nbPerRank + (ulong)(uVar25 - uVar21) * 2) = iVar16;
          }
          uVar7 = (ulong)(iVar16 - 1);
        }
        uVar21 = iVar20 >> (bVar8 & 0x1f);
        do {
          if ((int)uVar21 < 1) {
            do {
              iVar20 = nbPerRank._4_4_ + 0xf0f0f10;
              iVar16 = 0;
              uVar23 = uVar21;
              while( true ) {
                nbPerRank._4_4_ = nbPerRank._4_4_ + 1;
                if (-1 < (int)uVar23) goto LAB_00203fd6;
                if (iVar20 == iVar16) break;
                pcVar2 = (char *)((long)workSpace + (ulong)(uint)nbPerRank._4_4_ * 8 + 0xf);
                *pcVar2 = *pcVar2 + -1;
                uVar23 = uVar23 + 1;
                iVar16 = iVar16 + -1;
              }
              iVar20 = (int)uVar18;
              uVar18 = (long)iVar20 + 1;
              nbPerRank._4_4_ = iVar20 + 2;
              do {
                lVar6 = uVar18 * 8;
                uVar18 = uVar18 - 1;
                nbPerRank._4_4_ = nbPerRank._4_4_ - 1;
              } while (uVar25 == *(byte *)((long)workSpace + lVar6 + 7));
              pcVar2 = (char *)((long)workSpace + (long)(int)nbPerRank._4_4_ * 8 + 0xf);
              *pcVar2 = *pcVar2 + -1;
              uVar21 = (uVar21 - iVar16) + 1;
            } while( true );
          }
          uVar23 = 0x1f;
          if (uVar21 != 0) {
            for (; uVar21 >> uVar23 == 0; uVar23 = uVar23 - 1) {
            }
          }
          for (uVar7 = (ulong)((uVar23 ^ 0xffffffe0) + 0x21); 1 < uVar7; uVar7 = uVar7 - 1) {
            if (((ulong)*(uint *)(nbPerRank + uVar7 * 2) != 0xf0f0f0f0) &&
               ((*(uint *)(nbPerRank + (ulong)((int)uVar7 - 1) * 2) == 0xf0f0f0f0 ||
                (*(uint *)((long)workSpace + (ulong)*(uint *)(nbPerRank + uVar7 * 2) * 8 + 8) <=
                 (uint)(*(int *)((long)workSpace +
                                (ulong)*(uint *)(nbPerRank + (ulong)((int)uVar7 - 1) * 2) * 8 + 8) *
                       2))))) goto LAB_0020407d;
          }
          uVar7 = 1;
LAB_0020407d:
          uVar15 = uVar7 & 0xffffffff;
          uVar24 = uVar7 & 0xffffffff;
          if ((uint)uVar7 < 0xe) {
            uVar24 = 0xd;
          }
          for (; uVar23 = (uint)uVar24, uVar15 < 0xd; uVar15 = uVar15 + 1) {
            if (*(int *)(nbPerRank + uVar15 * 2) != -0xf0f0f10) {
              uVar23 = (uint)uVar15;
              break;
            }
          }
          uVar11 = uVar23 - 1;
          uVar12 = *(uint *)(nbPerRank + (ulong)uVar23 * 2);
          pcVar2 = (char *)((long)workSpace + (ulong)uVar12 * 8 + 0xf);
          *pcVar2 = *pcVar2 + '\x01';
          uVar17 = *(uint *)(nbPerRank + (ulong)uVar11 * 2);
          if (*(uint *)(nbPerRank + (ulong)uVar11 * 2) == 0xf0f0f0f0) {
            uVar17 = uVar12;
          }
          *(uint *)(nbPerRank + (ulong)uVar11 * 2) = uVar17;
          if ((ulong)uVar12 == 0) {
            uVar12 = 0xf0f0f0f0;
          }
          else {
            uVar12 = uVar12 - 1;
            if (uVar25 - uVar23 != (uint)*(byte *)((long)workSpace + (ulong)uVar12 * 8 + 0xf)) {
              uVar12 = 0xf0f0f0f0;
            }
          }
          uVar21 = uVar21 + (-1 << ((byte)uVar11 & 0x1f));
          *(uint *)(nbPerRank + (ulong)uVar23 * 2) = uVar12;
        } while( true );
      }
      uVar25 = (uint)bVar4;
LAB_00203fd6:
      if (uVar25 < 0xd) {
        nbPerRank[8] = 0;
        nbPerRank[9] = 0;
        nbPerRank[10] = 0;
        nbPerRank[0xb] = 0;
        nbPerRank[0xc] = 0;
        nbPerRank[0] = 0;
        nbPerRank[1] = 0;
        nbPerRank[2] = 0;
        nbPerRank[3] = 0;
        nbPerRank[4] = 0;
        nbPerRank[5] = 0;
        nbPerRank[6] = 0;
        nbPerRank[7] = 0;
        auStack_58[8] = 0;
        auStack_58[9] = 0;
        auStack_58[10] = 0;
        auStack_58[0xb] = 0;
        auStack_58[0xc] = 0;
        auStack_58[0] = 0;
        auStack_58[1] = 0;
        auStack_58[2] = 0;
        auStack_58[3] = 0;
        auStack_58[4] = 0;
        auStack_58[5] = 0;
        auStack_58[6] = 0;
        auStack_58[7] = 0;
        lVar6 = -1;
        if (-1 < (long)iVar10) {
          lVar6 = (long)iVar10;
        }
        for (lVar13 = 0; lVar6 + 1 != lVar13; lVar13 = lVar13 + 1) {
          nbPerRank[*(byte *)((long)workSpace + lVar13 * 8 + 0xf)] =
               nbPerRank[*(byte *)((long)workSpace + lVar13 * 8 + 0xf)] + 1;
        }
        uVar9 = 0;
        sStack_b0 = (size_t)uVar25;
        for (uVar18 = sStack_b0; 0 < (long)uVar18; uVar18 = uVar18 - 1) {
          auStack_58[uVar18] = uVar9;
          uVar9 = (ushort)(uVar9 + nbPerRank[uVar18]) >> 1;
        }
        for (uVar18 = 0; uVar1 != uVar18; uVar18 = uVar18 + 1) {
          tree[*(byte *)((long)workSpace + uVar18 * 8 + 0xe)].nbBits =
               *(BYTE *)((long)workSpace + uVar18 * 8 + 0xf);
        }
        for (uVar18 = 0; uVar1 != uVar18; uVar18 = uVar18 + 1) {
          uVar9 = auStack_58[tree[uVar18].nbBits];
          auStack_58[tree[uVar18].nbBits] = uVar9 + 1;
          tree[uVar18].val = uVar9;
        }
      }
    }
    else {
      sStack_b0 = 0xffffffffffffffd2;
    }
  }
  else {
    sStack_b0 = 0xffffffffffffffff;
  }
  return sStack_b0;
}

Assistant:

size_t HUF_buildCTable_wksp (HUF_CElt* tree, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits, void* workSpace, size_t wkspSize)
{
    HUF_buildCTable_wksp_tables* const wksp_tables = (HUF_buildCTable_wksp_tables*)workSpace;
    nodeElt* const huffNode0 = wksp_tables->huffNodeTbl;
    nodeElt* const huffNode = huffNode0+1;
    int nonNullRank;

    /* safety checks */
    if (((size_t)workSpace & 3) != 0) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (wkspSize < sizeof(HUF_buildCTable_wksp_tables))
      return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX)
      return ERROR(maxSymbolValue_tooLarge);
    ZSTD_memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue, wksp_tables->rankPosition);

    /* build tree */
    nonNullRank = HUF_buildTree(huffNode, maxSymbolValue);

    /* enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, (U32)nonNullRank, maxNbBits);
    if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */

    HUF_buildCTableFromTree(tree, huffNode, nonNullRank, maxSymbolValue, maxNbBits);

    return maxNbBits;
}